

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_decimal.hpp
# Opt level: O2

duckdb_decimal * __thiscall
duckdb::TryCastToDecimalCInternal<double,duckdb::ToCDecimalCastWrapper<short>>
          (duckdb_decimal *__return_storage_ptr__,duckdb *this,double source,uint8_t width,
          uint8_t scale)

{
  bool bVar1;
  duckdb_decimal result;
  CastParameters parameters;
  duckdb_decimal local_50;
  CastParameters local_38;
  
  local_38.cast_data.ptr = (BoundCastData *)0x0;
  local_38.strict = false;
  local_38.error_message = (string *)0x0;
  local_38.local_state.ptr = (FunctionLocalState *)0x0;
  local_38.query_location.index = 0xffffffffffffffff;
  local_38.nullify_parent = false;
  bVar1 = ToCDecimalCastWrapper<short>::Operation<double>
                    (source,&local_50,&local_38,(uint8_t)this,width);
  if (bVar1) {
    (__return_storage_ptr__->value).upper = local_50.value.upper;
    __return_storage_ptr__->width = local_50.width;
    __return_storage_ptr__->scale = local_50.scale;
    *(undefined6 *)&__return_storage_ptr__->field_0x2 = local_50._2_6_;
    (__return_storage_ptr__->value).lower = local_50.value.lower;
  }
  else {
    FetchDefaultValue::Operation<duckdb_decimal>();
  }
  return __return_storage_ptr__;
}

Assistant:

duckdb_decimal TryCastToDecimalCInternal(SOURCE_TYPE source, uint8_t width, uint8_t scale) {
	duckdb_decimal result;
	try {
		CastParameters parameters;
		if (!OP::template Operation<SOURCE_TYPE>(source, result, parameters, width, scale)) {
			return FetchDefaultValue::Operation<duckdb_decimal>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<duckdb_decimal>();
	}
	return result;
}